

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O2

void __thiscall
sf::Window::create(Window *this,VideoMode mode,String *title,Uint32 style,ContextSettings *settings)

{
  pointer pVVar1;
  bool bVar2;
  WindowBase *pWVar3;
  ostream *poVar4;
  vector<sf::VideoMode,_std::allocator<sf::VideoMode>_> *pvVar5;
  WindowImpl *pWVar6;
  GlContext *pGVar7;
  uint uVar8;
  ContextSettings *settings_00;
  VideoMode mode_00;
  WindowImpl *local_40;
  uint local_38;
  
  uVar8 = mode.bitsPerPixel;
  pWVar6 = mode._0_8_;
  settings_00 = settings;
  local_40 = pWVar6;
  local_38 = uVar8;
  (*(this->super_WindowBase)._vptr_WindowBase[4])();
  if ((style & 8) != 0) {
    pWVar3 = WindowBase::getFullscreenWindow(&this->super_WindowBase);
    if (pWVar3 == (WindowBase *)0x0) {
      bVar2 = VideoMode::isValid((VideoMode *)&local_40);
      if (!bVar2) {
        poVar4 = err();
        poVar4 = std::operator<<(poVar4,
                                 "The requested video mode is not available, switching to a valid mode"
                                );
        std::endl<char,std::char_traits<char>>(poVar4);
        pvVar5 = VideoMode::getFullscreenModes();
        pVVar1 = (pvVar5->super__Vector_base<sf::VideoMode,_std::allocator<sf::VideoMode>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        local_40 = *(WindowImpl **)pVVar1;
        local_38 = pVVar1->bitsPerPixel;
      }
      WindowBase::setFullscreenWindow(&this->super_WindowBase,&this->super_WindowBase);
      pWVar6 = local_40;
      uVar8 = local_38;
    }
    else {
      poVar4 = err();
      poVar4 = std::operator<<(poVar4,
                               "Creating two fullscreen windows is not allowed, switching to windowed mode"
                              );
      std::endl<char,std::char_traits<char>>(poVar4);
      style = style & 0xfffffff7;
    }
  }
  mode_00.height = 0;
  mode_00.width = uVar8;
  mode_00.bitsPerPixel = (uint)title;
  pWVar6 = priv::WindowImpl::create
                     (pWVar6,mode_00,(String *)(ulong)((style & 6) != 0 | style),(Uint32)settings,
                      settings_00);
  (this->super_WindowBase).m_impl = pWVar6;
  pGVar7 = priv::GlContext::create(settings,pWVar6,local_38);
  this->m_context = pGVar7;
  initialize(this);
  return;
}

Assistant:

void Window::create(VideoMode mode, const String& title, Uint32 style, const ContextSettings& settings)
{
    // Destroy the previous window implementation
    close();

    // Fullscreen style requires some tests
    if (style & Style::Fullscreen)
    {
        // Make sure there's not already a fullscreen window (only one is allowed)
        if (getFullscreenWindow())
        {
            err() << "Creating two fullscreen windows is not allowed, switching to windowed mode" << std::endl;
            style &= ~static_cast<Uint32>(Style::Fullscreen);
        }
        else
        {
            // Make sure that the chosen video mode is compatible
            if (!mode.isValid())
            {
                err() << "The requested video mode is not available, switching to a valid mode" << std::endl;
                mode = VideoMode::getFullscreenModes()[0];
            }

            // Update the fullscreen window
            setFullscreenWindow(this);
        }
    }

    // Check validity of style according to the underlying platform
    #if defined(SFML_SYSTEM_IOS) || defined(SFML_SYSTEM_ANDROID)
        if (style & Style::Fullscreen)
            style &= ~static_cast<Uint32>(Style::Titlebar);
        else
            style |= Style::Titlebar;
    #else
        if ((style & Style::Close) || (style & Style::Resize))
            style |= Style::Titlebar;
    #endif

    // Recreate the window implementation
    m_impl = priv::WindowImpl::create(mode, title, style, settings);

    // Recreate the context
    m_context = priv::GlContext::create(settings, m_impl, mode.bitsPerPixel);

    // Perform common initializations
    initialize();
}